

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O1

int Cudd_DumpDot(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  int *piVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  void *__s;
  DdNode *pDVar5;
  st__table *visited;
  st__generator *gen;
  ulong uVar6;
  undefined4 in_register_00000034;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  DdNode **ppDVar13;
  bool bVar14;
  DdNode *local_80;
  st__table *local_78;
  DdManager *local_70;
  DdNode **local_68;
  long local_60;
  ulong local_58;
  DdNode **local_50;
  DdNode **local_48;
  char **local_40;
  long local_38;
  
  local_58 = CONCAT44(in_register_00000034,n);
  iVar3 = dd->size;
  lVar11 = (long)iVar3;
  local_68 = f;
  local_48 = (DdNode **)inames;
  __s = malloc(lVar11 * 4);
  if (__s == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    if (0 < iVar3) {
      memset(__s,0,lVar11 * 4);
    }
    iVar3 = (int)local_58;
    pDVar5 = Cudd_VectorSupport(dd,local_68,iVar3);
    if (pDVar5 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      uVar10 = pDVar5->index;
      local_80 = pDVar5;
      while (uVar10 != 0x7fffffff) {
        *(undefined4 *)((long)__s + (ulong)uVar10 * 4) = 1;
        local_80 = (local_80->type).kids.T;
        uVar10 = local_80->index;
      }
      local_40 = onames;
      Cudd_RecursiveDeref(dd,pDVar5);
      visited = st__init_table(st__ptrcmp,st__ptrhash);
      if (visited != (st__table *)0x0) {
        local_60 = lVar11;
        if (0 < iVar3) {
          uVar6 = local_58 & 0xffffffff;
          uVar12 = 0;
          do {
            iVar3 = cuddCollectNodes((DdNode *)((ulong)local_68[uVar12] & 0xfffffffffffffffe),
                                     visited);
            if (iVar3 == 0) goto LAB_0092261c;
            uVar12 = uVar12 + 1;
          } while (uVar6 != uVar12);
        }
        pDVar5 = *local_68;
        local_70 = dd;
        gen = st__init_gen(visited);
        if (gen != (st__generator *)0x0) {
          local_78 = visited;
          iVar3 = st__gen(gen,(char **)&local_80,(char **)0x0);
          uVar6 = 0;
          if (iVar3 != 0) {
            uVar6 = 0;
            do {
              uVar6 = uVar6 | (ulong)local_80 ^ (ulong)pDVar5 & 0xfffffffffffffffe;
              iVar3 = st__gen(gen,(char **)&local_80,(char **)0x0);
            } while (iVar3 != 0);
          }
          st__free_gen(gen);
          uVar10 = 0;
          do {
            uVar8 = ~(-1 << ((byte)uVar10 & 0x1f));
            if ((long)uVar6 <= (long)(ulong)uVar8) break;
            bVar14 = uVar10 < 0x3c;
            uVar10 = uVar10 + 4;
          } while (bVar14);
          iVar3 = fprintf((FILE *)fp,"digraph \"DD\" {\n");
          if (iVar3 == -1) {
            return 0;
          }
          iVar3 = fprintf((FILE *)fp,"size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n");
          if (iVar3 == -1) {
            return 0;
          }
          iVar3 = fprintf((FILE *)fp,"{ node [shape = plaintext];\n");
          visited = local_78;
          if (((iVar3 != -1) &&
              (iVar3 = fprintf((FILE *)fp,"  edge [style = invis];\n"), visited = local_78,
              iVar3 != -1)) &&
             (iVar3 = fprintf((FILE *)fp,"  \"CONST NODES\" [style = invis];\n"),
             ppDVar13 = local_48, iVar3 != -1)) {
            if (0 < (int)local_60) {
              lVar11 = 0;
              do {
                if (*(int *)((long)__s + (long)local_70->invperm[lVar11] * 4) != 0) {
                  if ((ppDVar13 == (DdNode **)0x0) ||
                     (pDVar5 = ppDVar13[local_70->invperm[lVar11]], pDVar5 == (DdNode *)0x0)) {
                    iVar3 = fprintf((FILE *)fp,"\" %d \" -> ");
                  }
                  else {
                    iVar3 = fprintf((FILE *)fp,"\" %s \" -> ",pDVar5);
                  }
                  if (iVar3 == -1) goto LAB_0092261c;
                }
                lVar11 = lVar11 + 1;
              } while (local_60 != lVar11);
            }
            iVar3 = fprintf((FILE *)fp,"\"CONST NODES\"; \n}\n");
            if ((iVar3 != -1) &&
               (iVar3 = fprintf((FILE *)fp,
                                "{ rank = same; node [shape = box]; edge [style = invis];\n"),
               uVar6 = local_58, iVar3 != -1)) {
              iVar3 = (int)local_58;
              if (0 < iVar3) {
                local_50 = (DdNode **)(local_58 & 0xffffffff);
                ppDVar13 = (DdNode **)0x0;
                do {
                  if (local_40 == (char **)0x0) {
                    iVar4 = fprintf((FILE *)fp,"\"F%d\"",(ulong)ppDVar13 & 0xffffffff);
                  }
                  else {
                    iVar4 = fprintf((FILE *)fp,"\"  %s  \"",local_40[(long)ppDVar13]);
                  }
                  if (iVar4 == -1) goto LAB_0092261c;
                  pcVar7 = " -> ";
                  if ((DdNode **)(ulong)(iVar3 - 1) == ppDVar13) {
                    pcVar7 = "; }\n";
                  }
                  iVar4 = fprintf((FILE *)fp,pcVar7);
                  if (iVar4 == -1) goto LAB_0092261c;
                  ppDVar13 = (DdNode **)((long)ppDVar13 + 1);
                } while (local_50 != ppDVar13);
              }
              if (0 < (int)local_60) {
                lVar9 = 0;
                lVar11 = local_60;
                do {
                  if (*(int *)((long)__s + (long)local_70->invperm[lVar9] * 4) != 0) {
                    iVar3 = fprintf((FILE *)fp,"{ rank = same; ");
                    if (iVar3 == -1) goto LAB_0092261c;
                    if ((local_48 == (DdNode **)0x0) ||
                       (local_48[local_70->invperm[lVar9]] == (DdNode *)0x0)) {
                      iVar3 = fprintf((FILE *)fp,"\" %d \";\n",(ulong)(uint)local_70->invperm[lVar9]
                                     );
                    }
                    else {
                      iVar3 = fprintf((FILE *)fp,"\" %s \";\n");
                    }
                    if (iVar3 == -1) goto LAB_0092261c;
                    local_38 = (long)(int)local_70->subtables[lVar9].slots;
                    if (0 < local_38) {
                      local_50 = local_70->subtables[lVar9].nodelist;
                      lVar11 = 0;
                      do {
                        for (local_80 = local_50[lVar11]; local_80 != (DdNode *)0x0;
                            local_80 = local_80->next) {
                          iVar3 = st__lookup(visited,(char *)local_80,(char **)0x0);
                          if (iVar3 != 0) {
                            iVar3 = fprintf((FILE *)fp,"\"%lx\";\n",
                                            (ulong)((uint)local_80 & uVar8) / 0x28);
                            if (iVar3 == -1) goto LAB_0092261c;
                          }
                        }
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != local_38);
                    }
                    iVar3 = fprintf((FILE *)fp,"}\n");
                    lVar11 = local_60;
                    uVar6 = local_58;
                    if (iVar3 == -1) goto LAB_0092261c;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 != lVar11);
              }
              iVar3 = fprintf((FILE *)fp,"{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
              if (iVar3 != -1) {
                local_50 = (DdNode **)(long)(int)(local_70->constants).slots;
                if (0 < (long)local_50) {
                  local_48 = (local_70->constants).nodelist;
                  ppDVar13 = (DdNode **)0x0;
                  do {
                    for (local_80 = local_48[(long)ppDVar13]; local_80 != (DdNode *)0x0;
                        local_80 = local_80->next) {
                      iVar3 = st__lookup(visited,(char *)local_80,(char **)0x0);
                      if (iVar3 != 0) {
                        iVar3 = fprintf((FILE *)fp,"\"%lx\";\n",
                                        (ulong)((uint)local_80 & uVar8) / 0x28);
                        if (iVar3 == -1) goto LAB_0092261c;
                      }
                    }
                    ppDVar13 = (DdNode **)((long)ppDVar13 + 1);
                  } while (ppDVar13 != local_50);
                }
                iVar3 = fprintf((FILE *)fp,"}\n}\n");
                ppcVar2 = local_40;
                if (iVar3 != -1) {
                  if (0 < (int)uVar6) {
                    uVar12 = 0;
                    do {
                      if (ppcVar2 == (char **)0x0) {
                        iVar3 = fprintf((FILE *)fp,"\"F%d\"",uVar12 & 0xffffffff);
                      }
                      else {
                        iVar3 = fprintf((FILE *)fp,"\"  %s  \"",ppcVar2[uVar12]);
                      }
                      visited = local_78;
                      if (iVar3 == -1) goto LAB_0092261c;
                      pcVar7 = " -> \"%lx\" [style = dotted];\n";
                      if (((ulong)local_68[uVar12] & 1) == 0) {
                        pcVar7 = " -> \"%lx\" [style = solid];\n";
                      }
                      iVar3 = fprintf((FILE *)fp,pcVar7,
                                      (ulong)(uVar8 & (uint)local_68[uVar12]) / 0x28);
                      visited = local_78;
                      if (iVar3 == -1) goto LAB_0092261c;
                      uVar12 = uVar12 + 1;
                    } while ((uVar6 & 0xffffffff) != uVar12);
                  }
                  if (0 < (int)local_60) {
                    lVar11 = 0;
                    do {
                      if (*(int *)((long)__s + (long)local_70->invperm[lVar11] * 4) != 0) {
                        local_58 = (ulong)(int)local_70->subtables[lVar11].slots;
                        if (0 < (long)local_58) {
                          local_68 = local_70->subtables[lVar11].nodelist;
                          uVar6 = 0;
                          do {
                            for (local_80 = local_68[uVar6]; local_80 != (DdNode *)0x0;
                                local_80 = local_80->next) {
                              iVar3 = st__lookup(local_78,(char *)local_80,(char **)0x0);
                              if (iVar3 != 0) {
                                iVar3 = fprintf((FILE *)fp,"\"%lx\" -> \"%lx\";\n",
                                                (ulong)((uint)local_80 & uVar8) / 0x28,
                                                (ulong)(*(uint *)&local_80->type & uVar8) / 0x28);
                                visited = local_78;
                                if (iVar3 == -1) goto LAB_0092261c;
                                uVar12 = *(ulong *)((long)&local_80->type + 8);
                                pcVar7 = "\"%lx\" -> \"%lx\" [style = dotted];\n";
                                if ((uVar12 & 1) == 0) {
                                  pcVar7 = "\"%lx\" -> \"%lx\" [style = dashed];\n";
                                }
                                iVar3 = fprintf((FILE *)fp,pcVar7,
                                                (ulong)((uint)local_80 & uVar8) / 0x28,
                                                (ulong)((uint)uVar12 & uVar8) / 0x28);
                                visited = local_78;
                                if (iVar3 == -1) goto LAB_0092261c;
                              }
                            }
                            uVar6 = uVar6 + 1;
                          } while (uVar6 != local_58);
                        }
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar11 != local_60);
                  }
                  lVar11 = (long)(int)(local_70->constants).slots;
                  if (0 < lVar11) {
                    local_68 = (local_70->constants).nodelist;
                    lVar9 = 0;
                    do {
                      for (local_80 = local_68[lVar9]; local_80 != (DdNode *)0x0;
                          local_80 = local_80->next) {
                        iVar3 = st__lookup(local_78,(char *)local_80,(char **)0x0);
                        if ((iVar3 != 0) &&
                           (iVar3 = fprintf((FILE *)fp,"\"%lx\" [label = \"%g\"];\n",
                                            (local_80->type).value,
                                            (ulong)((uint)local_80 & uVar8) / 0x28),
                           visited = local_78, iVar3 == -1)) goto LAB_0092261c;
                      }
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != lVar11);
                  }
                  iVar3 = fprintf((FILE *)fp,"}\n");
                  visited = local_78;
                  if (iVar3 != -1) {
                    st__free_table(local_78);
                    free(__s);
                    return 1;
                  }
                }
              }
            }
          }
        }
        goto LAB_0092261c;
      }
    }
  }
  visited = (st__table *)0x0;
LAB_0092261c:
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (visited != (st__table *)0x0) {
    st__free_table(visited);
  }
  return 0;
}

Assistant:

int
Cudd_DumpDot(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode      *support = NULL;
    DdNode      *scan;
    int         *sorted = NULL;
    int         nvars = dd->size;
    st__table    *visited = NULL;
    st__generator *gen = NULL;
    int         retval;
    int         i, j;
    int         slots;
    DdNodePtr   *nodelist;
    long        refAddr, diff, mask;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    support = Cudd_VectorSupport(dd,f,n);
    if (support == NULL) goto failure;
    cuddRef(support);
    scan = support;
    while (!cuddIsConstant(scan)) {
        sorted[scan->index] = 1;
        scan = cuddT(scan);
    }
    Cudd_RecursiveDeref(dd,support);
    support = NULL; /* so that we do not try to free it in case of failure */

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(Cudd_Regular(f[i]),visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (long) Cudd_Regular(f[0]);
    diff = 0;
    gen = st__init_gen(visited);
    if (gen == NULL) goto failure;
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (long) scan;
    }
    st__free_gen(gen); gen = NULL;

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(long); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }

    /* Write the header and the global attributes. */
    retval = fprintf(fp,"digraph \"DD\" {\n");
    if (retval == EOF) return(0);
    retval = fprintf(fp,
        "size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n");
    if (retval == EOF) return(0);

    /* Write the input name subgraph by scanning the support array. */
    retval = fprintf(fp,"{ node [shape = plaintext];\n");
    if (retval == EOF) goto failure;
    retval = fprintf(fp,"  edge [style = invis];\n");
    if (retval == EOF) goto failure;
    /* We use a name ("CONST NODES") with an embedded blank, because
    ** it is unlikely to appear as an input name.
    */
    retval = fprintf(fp,"  \"CONST NODES\" [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            if (inames == NULL || inames[dd->invperm[i]] == NULL) {
                retval = fprintf(fp,"\" %d \" -> ", dd->invperm[i]);
            } else {
                retval = fprintf(fp,"\" %s \" -> ", inames[dd->invperm[i]]);
            }
            if (retval == EOF) goto failure;
        }
    }
    retval = fprintf(fp,"\"CONST NODES\"; \n}\n");
    if (retval == EOF) goto failure;

    /* Write the output node subgraph. */
    retval = fprintf(fp,"{ rank = same; node [shape = box]; edge [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        if (i == n - 1) {
            retval = fprintf(fp,"; }\n");
        } else {
            retval = fprintf(fp," -> ");
        }
        if (retval == EOF) goto failure;
    }

    /* Write rank info: All nodes with the same index have the same rank. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            retval = fprintf(fp,"{ rank = same; ");
            if (retval == EOF) goto failure;
            if (inames == NULL || inames[dd->invperm[i]] == NULL) {
                retval = fprintf(fp,"\" %d \";\n", dd->invperm[i]);
            } else {
                retval = fprintf(fp,"\" %s \";\n", inames[dd->invperm[i]]);
            }
            if (retval == EOF) goto failure;
            nodelist = dd->subtables[i].nodelist;
            slots = dd->subtables[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp,"\"%lx\";\n", ((mask & (ptrint) scan) / sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
            retval = fprintf(fp,"}\n");
            if (retval == EOF) goto failure;
        }
    }

    /* All constants have the same rank. */
    retval = fprintf(fp,
        "{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
    if (retval == EOF) goto failure;
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%lx\";\n", ((mask & (ptrint) scan) / sizeof(DdNode)));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }
    retval = fprintf(fp,"}\n}\n");
    if (retval == EOF) goto failure;

    /* Write edge info. */
    /* Edges from the output nodes. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        /* Account for the possible complement on the root. */
        if (Cudd_IsComplement(f[i])) {
            retval = fprintf(fp," -> \"%lx\" [style = dotted];\n", ((mask & (ptrint) f[i]) / sizeof(DdNode)));
        } else {
            retval = fprintf(fp," -> \"%lx\" [style = solid];\n", ((mask & (ptrint) f[i]) / sizeof(DdNode)));
        }
        if (retval == EOF) goto failure;
    }

    /* Edges from internal nodes. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            nodelist = dd->subtables[i].nodelist;
            slots = dd->subtables[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp, "\"%lx\" -> \"%lx\";\n", 
                            ((mask & (ptrint) scan) / sizeof(DdNode)),
                            ((mask & (ptrint) cuddT(scan)) / sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                        if (Cudd_IsComplement(cuddE(scan))) {
                            retval = fprintf(fp,"\"%lx\" -> \"%lx\" [style = dotted];\n", 
                                ((mask & (ptrint) scan) / sizeof(DdNode)),
                                ((mask & (ptrint) cuddE(scan)) / sizeof(DdNode)));
                        } else {
                            retval = fprintf(fp, "\"%lx\" -> \"%lx\" [style = dashed];\n", 
                                ((mask & (ptrint) scan) / sizeof(DdNode)),
                                ((mask & (ptrint) cuddE(scan)) / sizeof(DdNode)));
                        }
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
        }
    }

    /* Write constant labels. */
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%lx\" [label = \"%g\"];\n", 
                    ((mask & (ptrint) scan) / sizeof(DdNode)), cuddV(scan));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }

    /* Write trailer and return. */
    retval = fprintf(fp,"}\n");
    if (retval == EOF) goto failure;

    st__free_table(visited);
    ABC_FREE(sorted);
    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    if (visited != NULL) st__free_table(visited);
    return(0);

}